

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O1

bool summarize_holdout_set(vw *all,size_t *no_win_counter)

{
  double dVar1;
  size_t sVar2;
  float fVar3;
  double dVar4;
  
  dVar1 = all->sd->weighted_holdout_examples_since_last_pass;
  if (dVar1 <= 0.0) {
    fVar3 = 1.7014117e+38;
  }
  else {
    fVar3 = (float)(all->sd->holdout_sum_loss_since_last_pass / dVar1);
  }
  if (all->all_reduce != (AllReduce *)0x0) {
    fVar3 = accumulate_scalar(all,fVar3);
  }
  all->sd->weighted_holdout_examples_since_last_pass = 0.0;
  all->sd->holdout_sum_loss_since_last_pass = 0.0;
  dVar4 = (double)fVar3;
  dVar1 = all->sd->holdout_best_loss;
  if (dVar1 <= dVar4) {
    if (fVar3 == 3.4028235e+38 && 0x7fefffffffffffff < (ulong)ABS(dVar1)) goto LAB_00235c57;
    sVar2 = *no_win_counter + 1;
  }
  else {
    all->sd->holdout_best_loss = dVar4;
    all->sd->holdout_best_pass = all->current_pass;
    sVar2 = 0;
  }
  *no_win_counter = sVar2;
LAB_00235c57:
  return dVar4 < dVar1;
}

Assistant:

bool summarize_holdout_set(vw& all, size_t& no_win_counter)
{
  float thisLoss = (all.sd->weighted_holdout_examples_since_last_pass > 0)
      ? (float)(all.sd->holdout_sum_loss_since_last_pass / all.sd->weighted_holdout_examples_since_last_pass)
      : FLT_MAX * 0.5f;
  if (all.all_reduce != nullptr)
    thisLoss = accumulate_scalar(all, thisLoss);

  all.sd->weighted_holdout_examples_since_last_pass = 0;
  all.sd->holdout_sum_loss_since_last_pass = 0;

  if (thisLoss < all.sd->holdout_best_loss)
  {
    all.sd->holdout_best_loss = thisLoss;
    all.sd->holdout_best_pass = all.current_pass;
    no_win_counter = 0;
    return true;
  }

  if ((thisLoss != FLT_MAX) ||
      (isfinite(
          all.sd->holdout_best_loss)))  // it's only a loss if we're not infinite when the previous one wasn't infinite
    no_win_counter++;
  return false;
}